

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,first_type fn,
          return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
          *a1,...)

{
  undefined8 in_R8;
  first_type local_60;
  return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
  *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined1 local_8 [8];
  
  local_48 = local_8;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  local_60 = fn;
  local_58 = a1;
  local_50 = in_R8;
  local_40 = local_48;
  local_38 = local_48;
  def_impl<AbstractModuleClient,HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::detail::def_helper<boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (this,(AbstractModuleClient *)0x0,name,fn,
             (def_helper<boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)a1,&local_50,&local_60);
  return;
}

Assistant:

void def_maybe_overloads(
        char const* name
        , Fn fn
        , A1 const& a1
        , ...)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name
          , fn
          , detail::def_helper<A1>(a1)
          , &fn
        );

    }